

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O0

void __thiscall Image::addChannel(Image *this,string *name,Channel *channel)

{
  mapped_type pIVar1;
  mapped_type *ppIVar2;
  ArgExc *this_00;
  key_type *in_RDX;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageChannel_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageChannel_*>_>_>
  *in_RSI;
  undefined8 in_RDI;
  int iVar3;
  undefined4 in_stack_ffffffffffffffdc;
  TypedImageChannel<Imath_3_2::half> *in_stack_ffffffffffffffe0;
  
  iVar3 = *(int *)in_RDX;
  if (iVar3 == 0) {
    pIVar1 = (mapped_type)operator_new(0x30);
    TypedImageChannel<unsigned_int>::TypedImageChannel
              ((TypedImageChannel<unsigned_int> *)in_stack_ffffffffffffffe0,
               (Image *)CONCAT44(in_stack_ffffffffffffffdc,iVar3),(int)((ulong)in_RDI >> 0x20),
               (int)in_RDI);
    ppIVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageChannel_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageChannel_*>_>_>
              ::operator[](in_RSI,in_RDX);
    *ppIVar2 = pIVar1;
  }
  else if (iVar3 == 1) {
    pIVar1 = (mapped_type)operator_new(0x30);
    TypedImageChannel<Imath_3_2::half>::TypedImageChannel
              (in_stack_ffffffffffffffe0,(Image *)CONCAT44(in_stack_ffffffffffffffdc,iVar3),
               (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
    ppIVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageChannel_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageChannel_*>_>_>
              ::operator[](in_RSI,in_RDX);
    *ppIVar2 = pIVar1;
  }
  else {
    if (iVar3 != 2) {
      this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_2::ArgExc::ArgExc(this_00,"Unknown channel type.");
      __cxa_throw(this_00,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
    }
    pIVar1 = (mapped_type)operator_new(0x30);
    TypedImageChannel<float>::TypedImageChannel
              ((TypedImageChannel<float> *)in_stack_ffffffffffffffe0,
               (Image *)CONCAT44(in_stack_ffffffffffffffdc,iVar3),(int)((ulong)in_RDI >> 0x20),
               (int)in_RDI);
    ppIVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageChannel_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageChannel_*>_>_>
              ::operator[](in_RSI,in_RDX);
    *ppIVar2 = pIVar1;
  }
  return;
}

Assistant:

void
Image::addChannel (const string& name, const IMF::Channel& channel)
{
    switch (channel.type)
    {
        case IMF::HALF:
            _channels[name] =
                new HalfChannel (*this, channel.xSampling, channel.ySampling);
            break;

        case IMF::FLOAT:
            _channels[name] =
                new FloatChannel (*this, channel.xSampling, channel.ySampling);
            break;

        case IMF::UINT:
            _channels[name] =
                new UIntChannel (*this, channel.xSampling, channel.ySampling);
            break;

        default: throw IEX::ArgExc ("Unknown channel type.");
    }
}